

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblock.c
# Opt level: O2

int curlx_nonblock(curl_socket_t sockfd,int nonblock)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_0000003c;
  
  iVar3 = 0;
  uVar1 = fcntl64(CONCAT44(in_register_0000003c,sockfd),3,0);
  if ((int)uVar1 < 0) {
    iVar3 = -1;
  }
  else if (((uVar1 >> 0xb & 1) == 0) == (nonblock != 0)) {
    uVar2 = uVar1 & 0x7ffff7ff;
    if (nonblock != 0) {
      uVar2 = uVar1 | 0x800;
    }
    iVar3 = fcntl64(sockfd,4,uVar2);
    return iVar3;
  }
  return iVar3;
}

Assistant:

int curlx_nonblock(curl_socket_t sockfd,    /* operate on this */
                   int nonblock   /* TRUE or FALSE */)
{
#if defined(HAVE_FCNTL_O_NONBLOCK)
  /* most recent Unix versions */
  int flags;
  flags = sfcntl(sockfd, F_GETFL, 0);
  if(flags < 0)
    return -1;
  /* Check if the current file status flags have already satisfied
   * the request, if so, it is no need to call fcntl() to replicate it.
   */
  if(!!(flags & O_NONBLOCK) == !!nonblock)
    return 0;
  if(nonblock)
    flags |= O_NONBLOCK;
  else
    flags &= ~O_NONBLOCK;
  return sfcntl(sockfd, F_SETFL, flags);

#elif defined(HAVE_IOCTL_FIONBIO)

  /* older Unix versions */
  int flags = nonblock ? 1 : 0;
  return ioctl(sockfd, FIONBIO, &flags);

#elif defined(HAVE_IOCTLSOCKET_FIONBIO)

  /* Windows */
  unsigned long flags = nonblock ? 1UL : 0UL;
  return ioctlsocket(sockfd, (long)FIONBIO, &flags);

#elif defined(HAVE_IOCTLSOCKET_CAMEL_FIONBIO)

  /* Amiga */
  long flags = nonblock ? 1L : 0L;
  return IoctlSocket(sockfd, FIONBIO, (char *)&flags);

#elif defined(HAVE_SETSOCKOPT_SO_NONBLOCK)

  /* Orbis OS */
  long b = nonblock ? 1L : 0L;
  return setsockopt(sockfd, SOL_SOCKET, SO_NONBLOCK, &b, sizeof(b));

#else
#  error "no non-blocking method was found/used/set"
#endif
}